

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::removeRow(tst_RootIndexProxyModel *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  QList<QVariant> arguments;
  Data *local_280;
  QVariant *local_278;
  QAbstractItemModel *pQStack_270;
  RootIndexProxyModel proxyModel;
  QModelIndex local_250;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  QSignalSpy proxyRowsAboutToBeRemovedSpy;
  QSignalSpy proxyRowsRemovedSpy;
  QSignalSpy sourceRowsRemovedSpy;
  QSignalSpy sourceRowsAboutToBeRemovedSpy;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  proxyRowsRemovedSpy.super_QObject = (QObject)0xff;
  proxyRowsRemovedSpy._1_7_ = 0xffffffffffffff;
  proxyRowsRemovedSpy._8_8_ = 0;
  proxyRowsRemovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  (**(code **)(*(long *)parent + 0x60))(&proxyRowsAboutToBeRemovedSpy,parent,1,0);
  RootIndexProxyModel::setRootIndex((QModelIndex *)&proxyModel);
  QSignalSpy::QSignalSpy
            (&proxyRowsAboutToBeRemovedSpy,(QObject *)&proxyModel,
             "2rowsAboutToBeRemoved(QModelIndex, int, int)");
  cVar1 = QTest::qVerify(proxyRowsAboutToBeRemovedSpy.sig.d.size != 0,
                         "proxyRowsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xff);
  if (cVar1 != '\0') {
    QSignalSpy::QSignalSpy
              (&proxyRowsRemovedSpy,(QObject *)&proxyModel,"2rowsRemoved(QModelIndex, int, int)");
    cVar1 = QTest::qVerify(proxyRowsRemovedSpy.sig.d.size != 0,"proxyRowsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x101);
    if (cVar1 != '\0') {
      QSignalSpy::QSignalSpy
                (&sourceRowsAboutToBeRemovedSpy,(QObject *)parent,
                 "2rowsAboutToBeRemoved(QModelIndex, int, int)");
      cVar1 = QTest::qVerify(sourceRowsAboutToBeRemovedSpy.sig.d.size != 0,
                             "sourceRowsAboutToBeRemovedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x103);
      if (cVar1 != '\0') {
        QSignalSpy::QSignalSpy
                  (&sourceRowsRemovedSpy,(QObject *)parent,"2rowsRemoved(QModelIndex, int, int)");
        cVar1 = QTest::qVerify(sourceRowsRemovedSpy.sig.d.size != 0,"sourceRowsRemovedSpy.isValid()"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x105);
        if (cVar1 != '\0') {
          local_280 = (Data *)0xffffffffffffffff;
          local_278 = (QVariant *)0x0;
          pQStack_270 = (QAbstractItemModel *)0x0;
          (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
          iVar3 = (**(code **)(*(long *)parent + 0x78))(parent,&arguments);
          arguments.d.d = (Data *)0xffffffffffffffff;
          arguments.d.ptr = (QVariant *)0x0;
          arguments.d.size = 0;
          iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)&proxyModel);
          cVar1 = QTest::qCompare(iVar3,iVar4,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0x107);
          if (cVar1 != '\0') {
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            RootIndexProxyModel::removeRows((int)&proxyModel,1,(QModelIndex *)0x1);
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            iVar4 = RootIndexProxyModel::rowCount((QModelIndex *)&proxyModel);
            cVar1 = QTest::qCompare(iVar3 + -1,iVar4,"oldRowCount - 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0x109);
            if (cVar1 != '\0') {
              local_280 = (Data *)0xffffffffffffffff;
              local_278 = (QVariant *)0x0;
              pQStack_270 = (QAbstractItemModel *)0x0;
              (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
              iVar4 = (**(code **)(*(long *)parent + 0x78))(parent,&arguments);
              cVar1 = QTest::qCompare(iVar3 + -1,iVar4,"oldRowCount - 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0x10a);
              if (cVar1 != '\0') {
                cVar1 = QTest::qCompare(proxyRowsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>.d
                                        .size,1,"proxyRowsAboutToBeRemovedSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                        ,0x10b);
                if (cVar1 != '\0') {
                  QList<QList<QVariant>_>::takeFirst
                            (&arguments,&proxyRowsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>)
                  ;
                  qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                  local_250.r = -1;
                  local_250.c = -1;
                  local_250.i = 0;
                  local_250.m = (QAbstractItemModel *)0x0;
                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                    ((QModelIndex *)&local_280,&local_250,
                                     "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x10d);
                  if (bVar2) {
                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0x10e);
                    if (cVar1 != '\0') {
                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0x10f);
                      if (cVar1 != '\0') {
                        cVar1 = QTest::qCompare(proxyRowsRemovedSpy.super_QList<QList<QVariant>_>.d.
                                                size,1,"proxyRowsRemovedSpy.count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                ,0x110);
                        if (cVar1 != '\0') {
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)&local_280,
                                     &proxyRowsRemovedSpy.super_QList<QList<QVariant>_>);
                          QArrayDataPointer<QVariant>::operator=
                                    (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280);
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_280);
                          qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                          local_250.r = -1;
                          local_250.c = -1;
                          local_250.i = 0;
                          local_250.m = (QAbstractItemModel *)0x0;
                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                            ((QModelIndex *)&local_280,&local_250,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x112);
                          if (bVar2) {
                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                            cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x113);
                            if (cVar1 != '\0') {
                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                              cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x114);
                              if (cVar1 != '\0') {
                                cVar1 = QTest::qCompare(sourceRowsAboutToBeRemovedSpy.
                                                        super_QList<QList<QVariant>_>.d.size,1,
                                                        "sourceRowsAboutToBeRemovedSpy.count()","1",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x115);
                                if (cVar1 != '\0') {
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)&local_280,
                                             &sourceRowsAboutToBeRemovedSpy.
                                              super_QList<QList<QVariant>_>);
                                  QArrayDataPointer<QVariant>::operator=
                                            (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280)
                                  ;
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_280);
                                  qvariant_cast<QModelIndex>
                                            ((QModelIndex *)&local_280,arguments.d.ptr);
                                  local_238 = 0xffffffffffffffff;
                                  local_230 = 0;
                                  uStack_228 = 0;
                                  (**(code **)(*(long *)parent + 0x60))(&local_250,parent,1,0);
                                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    ((QModelIndex *)&local_280,&local_250,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x117);
                                  if (bVar2) {
                                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x118);
                                    if (cVar1 != '\0') {
                                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x119);
                                      if (cVar1 != '\0') {
                                        cVar1 = QTest::qCompare(sourceRowsRemovedSpy.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,1,"sourceRowsRemovedSpy.count()",
                                                                "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11a);
                                        if (cVar1 != '\0') {
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)&local_280,
                                                     &sourceRowsRemovedSpy.
                                                      super_QList<QList<QVariant>_>);
                                          QArrayDataPointer<QVariant>::operator=
                                                    (&arguments.d,
                                                     (QArrayDataPointer<QVariant> *)&local_280);
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_280);
                                          qvariant_cast<QModelIndex>
                                                    ((QModelIndex *)&local_280,arguments.d.ptr);
                                          local_238 = 0xffffffffffffffff;
                                          local_230 = 0;
                                          uStack_228 = 0;
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_250,parent,1,0);
                                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            ((QModelIndex *)&local_280,&local_250,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11c);
                                          if (bVar2) {
                                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                            cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11d);
                                            if (cVar1 != '\0') {
                                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                              cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11e);
                                              if (cVar1 != '\0') {
                                                QObject::deleteLater();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  QArrayDataPointer<QVariant>::~QArrayDataPointer(&arguments.d);
                }
              }
            }
          }
        }
        QSignalSpy::~QSignalSpy(&sourceRowsRemovedSpy);
      }
      QSignalSpy::~QSignalSpy(&sourceRowsAboutToBeRemovedSpy);
    }
    QSignalSpy::~QSignalSpy(&proxyRowsRemovedSpy);
  }
  QSignalSpy::~QSignalSpy(&proxyRowsAboutToBeRemovedSpy);
  RootIndexProxyModel::~RootIndexProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_RootIndexProxyModel::removeRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeRemovedSpy(&proxyModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxyRowsRemovedSpy(&proxyModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsRemovedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeRemovedSpy(baseModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy sourceRowsRemovedSpy(baseModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsRemovedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.removeRows(1, 1);
    QCOMPARE(oldRowCount - 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount - 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeRemovedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsRemovedSpy.count(), 1);
    arguments = proxyRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeRemovedSpy.count(), 1);
    arguments = sourceRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsRemovedSpy.count(), 1);
    arguments = sourceRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}